

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionContext_AddPegoutTxOut_Test::TestBody
          (ConfidentialTransactionContext_AddPegoutTxOut_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char cVar3;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  char *pcVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  undefined1 local_550 [24];
  undefined1 local_538 [32];
  AssertionResult gtest_ar_2;
  undefined1 local_508 [16];
  undefined1 *local_4f8 [2];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [32];
  undefined1 *local_4b8 [2];
  undefined1 local_4a8 [16];
  undefined1 *local_498 [2];
  undefined1 local_488 [16];
  undefined1 *local_478 [2];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  Address pegout_addr;
  pointer local_440;
  undefined8 local_438;
  undefined1 local_428 [16];
  void *local_418;
  void *local_400;
  void *local_3e8;
  code *local_3d0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_358;
  Script local_340;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  undefined1 local_2d0 [40];
  undefined1 local_2a8 [16];
  ByteData local_298;
  void *local_280 [4];
  ConfidentialTransactionContext txc;
  Address addr;
  undefined1 *local_198;
  undefined1 local_188 [16];
  void *local_178;
  void *local_160;
  void *local_148;
  code *local_130 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  cfd::core::Address::Address(&addr);
  gtest_ar._0_8_ = local_550;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)&pegout_addr,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxIn
            ((Txid *)&txc,(uint)&pegout_addr,0,(Script *)0xfffffffd);
  _pegout_addr = &PTR__Txid_002dbe60;
  if (local_440 != (pointer)0x0) {
    operator_delete(local_440);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_550) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  pAVar1 = (AssertHelperData *)(local_538 + 0x10);
  local_538._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA","");
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&pegout_addr,(string *)local_538,(vector *)local_4f8);
  local_4d8._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  gtest_ar_2._0_8_ = local_508;
  local_4d8[8] = extraout_DL;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar_2,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225","");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)&gtest_ar_2);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)&txc,(Amount *)&pegout_addr,(ConfidentialAssetId *)local_4d8);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((undefined1 *)gtest_ar_2._0_8_ != local_508) {
    operator_delete((void *)gtest_ar_2._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_300);
  cfd::core::Script::~Script(&local_340);
  local_3d0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_358);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_3d0);
  if (local_3e8 != (void *)0x0) {
    operator_delete(local_3e8);
  }
  if (local_400 != (void *)0x0) {
    operator_delete(local_400);
  }
  if (local_418 != (void *)0x0) {
    operator_delete(local_418);
  }
  if ((undefined1 *)local_438 != local_428) {
    operator_delete((void *)local_438);
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_4f8);
  if ((AssertHelperData *)local_538._0_8_ != pAVar1) {
    operator_delete((void *)local_538._0_8_);
  }
  local_458._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_538._0_8_ = pAVar1;
  local_458[8] = extraout_DL_00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_538,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)local_538);
  local_4f8[0] = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f8,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
             "");
  cfd::core::BlockHash::BlockHash((BlockHash *)&gtest_ar_2,(string *)local_4f8);
  local_4d8._0_8_ = local_4d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d8,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo","");
  cfd::core::Address::Address(&pegout_addr,(string *)local_4d8);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,
             "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_2d0,(string *)local_498);
  local_4b8[0] = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b8,"cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL","");
  cfd::core::Privkey::FromWif((string *)local_280,(NetType)local_4b8,true);
  local_478[0] = local_468;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_478,
             "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
             ,"");
  local_2d0._24_8_ = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_2d0 + 0x18),
             "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"
             ,"");
  cfd::core::ByteData::ByteData(&local_298,(string *)(local_2d0 + 0x18));
  pcVar5 = (char *)0x2;
  cfd::ConfidentialTransactionContext::AddPegoutTxOut
            ((Amount *)&txc,(ConfidentialAssetId *)local_458,(BlockHash *)&gtest_ar,
             (Address *)&gtest_ar_2,(NetType)&pegout_addr,(Pubkey *)0x2,(Privkey *)local_2d0,
             (string *)local_280,(uint)(string *)local_478,(ByteData *)0x0,(NetType)&local_298,
             (Address *)0x4);
  if (local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_2d0._24_8_ != local_2a8) {
    operator_delete((void *)local_2d0._24_8_);
  }
  if (local_478[0] != local_468) {
    operator_delete(local_478[0]);
  }
  if (local_280[0] != (void *)0x0) {
    operator_delete(local_280[0]);
  }
  if (local_4b8[0] != local_4a8) {
    operator_delete(local_4b8[0]);
  }
  if ((pointer)local_2d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0]);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_300);
  cfd::core::Script::~Script(&local_340);
  local_3d0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_358);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_3d0);
  if (local_3e8 != (void *)0x0) {
    operator_delete(local_3e8);
  }
  if (local_400 != (void *)0x0) {
    operator_delete(local_400);
  }
  if (local_418 != (void *)0x0) {
    operator_delete(local_418);
  }
  if ((undefined1 *)local_438 != local_428) {
    operator_delete((void *)local_438);
  }
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_);
  }
  gtest_ar_2._0_8_ = &PTR__BlockHash_002dc1a0;
  if (gtest_ar_2.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar_2.message_.ptr_);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0]);
  }
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_002dc170;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)(local_538 + 0x10)) {
    operator_delete((void *)local_538._0_8_);
  }
  local_538._0_8_ = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  gtest_ar._0_8_ = local_550;
  local_538[8] = extraout_DL_01;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&pegout_addr,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxOutFee((Amount *)&txc,(ConfidentialAssetId *)local_538);
  _pegout_addr = &PTR__ConfidentialAssetId_002dc170;
  if (local_440 != (pointer)0x0) {
    operator_delete(local_440);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_550) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)_pegout_addr,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  if (_pegout_addr != (undefined **)&stack0xfffffffffffffbc8) {
    operator_delete(_pegout_addr);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pegout_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x141,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_538,(Message *)&pegout_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_538);
    if ((_func_int **)_pegout_addr != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((_func_int **)_pegout_addr != (_func_int **)0x0)) {
        (**(code **)(*_pegout_addr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"addr.GetAddress().c_str()",
             "\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",(char *)_pegout_addr,
             "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
  if (_pegout_addr != (undefined **)&stack0xfffffffffffffbc8) {
    operator_delete(_pegout_addr);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&pegout_addr);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x142,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_538,(Message *)&pegout_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_538);
    if ((_func_int **)_pegout_addr != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((_func_int **)_pegout_addr != (_func_int **)0x0)) {
        (**(code **)(*_pegout_addr + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar3 = cfd::ConfidentialTransactionContext::HasPegoutTxOut((uint)&txc);
  gtest_ar._0_8_ = CONCAT71(gtest_ar._1_7_,cVar3) ^ 1;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&pegout_addr,(internal *)&gtest_ar,
               (AssertionResult *)"txc.HasPegoutTxOut(0)","true","false",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x144,(char *)_pegout_addr);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (_pegout_addr != (undefined **)&stack0xfffffffffffffbc8) {
      operator_delete(_pegout_addr);
    }
    if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_538._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar2 = (bool)cfd::ConfidentialTransactionContext::HasPegoutTxOut((uint)&txc);
  gtest_ar.success_ = bVar2;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&pegout_addr,(internal *)&gtest_ar,
               (AssertionResult *)"txc.HasPegoutTxOut(1)","false","true",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x145,(char *)_pegout_addr);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (_pegout_addr != (undefined **)&stack0xfffffffffffffbc8) {
      operator_delete(_pegout_addr);
    }
    if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_538._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::ConfidentialTransactionContext::GetTxOutPegoutAddress((uint)&pegout_addr,(NetType)&txc);
  cfd::core::Address::GetAddress_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"pegout_addr.GetAddress()","addr.GetAddress()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538);
  if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)(local_538 + 0x10)) {
    operator_delete((void *)local_538._0_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_550) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_538,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x147,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_538,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_538);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_300);
  cfd::core::Script::~Script(&local_340);
  local_3d0[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_358);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_3d0);
  if (local_3e8 != (void *)0x0) {
    operator_delete(local_3e8);
  }
  if (local_400 != (void *)0x0) {
    operator_delete(local_400);
  }
  if (local_418 != (void *)0x0) {
    operator_delete(local_418);
  }
  if ((undefined1 *)local_438 != local_428) {
    operator_delete((void *)local_438);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  cfd::core::Script::~Script(&local_a0);
  local_130[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_130);
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (void *)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (void *)0x0) {
    operator_delete(local_178);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPegoutTxOut)
{
    ConfidentialTransactionContext txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");

    EXPECT_FALSE(txc.HasPegoutTxOut(0));
    EXPECT_TRUE(txc.HasPegoutTxOut(1));
    auto pegout_addr = txc.GetTxOutPegoutAddress(1, NetType::kRegtest);
    EXPECT_EQ(pegout_addr.GetAddress(), addr.GetAddress());
}